

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O3

int ffdt2s(int year,int month,int day,char *datestr,int *status)

{
  int iVar1;
  ulong uVar2;
  char *__format;
  ulong uVar3;
  
  if (0 < *status) {
    return *status;
  }
  *datestr = '\0';
  iVar1 = ffverifydate(year,month,day,status);
  if (iVar1 < 1) {
    uVar3 = (ulong)(year - 0x76cU);
    if (year - 0x76cU < 99) {
      __format = "%.2d/%.2d/%.2d";
      uVar2 = (ulong)(uint)day;
    }
    else {
      __format = "%.4d-%.2d-%.2d";
      uVar2 = (ulong)(uint)year;
      uVar3 = (ulong)(uint)day;
    }
    sprintf(datestr,__format,uVar2,(ulong)(uint)month,uVar3);
  }
  else {
    ffpmsg("invalid date (ffdt2s)");
  }
  return *status;
}

Assistant:

int ffdt2s(int year,          /* I - year (0 - 9999)           */
           int month,         /* I - month (1 - 12)            */
           int day,           /* I - day (1 - 31)              */
           char *datestr,     /* O - date string: "YYYY-MM-DD" */
           int   *status)     /* IO - error status             */
/*
  Construct a date character string
*/
{
    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    *datestr = '\0';
    
    if (ffverifydate(year, month, day, status) > 0)
    {
        ffpmsg("invalid date (ffdt2s)");
        return(*status);
    }

    if (year >= 1900 && year <= 1998)  /* use old 'dd/mm/yy' format */
        sprintf(datestr, "%.2d/%.2d/%.2d", day, month, year - 1900);

    else  /* use the new 'YYYY-MM-DD' format */
        sprintf(datestr, "%.4d-%.2d-%.2d", year, month, day);

    return(*status);
}